

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O1

int pfx_table_src_remove(pfx_table *pfx_table,rtr_socket *socket)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &pfx_table->lock;
  bVar4 = true;
  iVar3 = 1;
  while( true ) {
    pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if (((&pfx_table->ipv4)[iVar3 != 1] != (trie_node *)0x0) &&
       (iVar2 = pfx_table_remove_id(pfx_table,&pfx_table->ipv4 + (iVar3 != 1),
                                    (&pfx_table->ipv4)[iVar3 != 1],socket,0), iVar2 == -1)) break;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    iVar3 = iVar3 + -1;
    bVar4 = iVar3 == 0;
    if (!bVar4) {
LAB_00106be9:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return -(uint)bVar4;
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  goto LAB_00106be9;
}

Assistant:

RTRLIB_EXPORT int pfx_table_src_remove(struct pfx_table *pfx_table, const struct rtr_socket *socket)
{
	for (unsigned int i = 0; i < 2; i++) {
		struct trie_node **root = (i == 0 ? &(pfx_table->ipv4) : &(pfx_table->ipv6));

		pthread_rwlock_wrlock(&(pfx_table->lock));
		if (*root) {
			int rtval = pfx_table_remove_id(pfx_table, root, *root, socket, 0);

			if (rtval == PFX_ERROR) {
				pthread_rwlock_unlock(&pfx_table->lock);
				return PFX_ERROR;
			}
		}
		pthread_rwlock_unlock(&pfx_table->lock);
	}
	return PFX_SUCCESS;
}